

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

String * kj::_::operator*(String *__return_storage_ptr__,short *param_2,undefined8 param_3,
                         undefined8 param_4,CappedArray<char,_14UL> *param_5)

{
  CappedArray<char,_8UL> local_50;
  CappedArray<char,_14UL> local_40;
  
  local_50 = Stringifier::operator*((Stringifier *)&STR,*param_2);
  Stringifier::operator*(&local_40,(Stringifier *)&STR,*(int *)(param_2 + 2));
  concat<kj::CappedArray<char,8ul>,kj::StringPtr&,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)&local_50,(CappedArray<char,_8UL> *)(param_2 + 4),
             (StringPtr *)&local_40,param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}